

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall
icu_63::DecimalFormat::setDecimalFormatSymbols(DecimalFormat *this,DecimalFormatSymbols *symbols)

{
  DecimalFormatFields *pDVar1;
  DecimalFormatSymbols *pDVar2;
  DecimalFormatSymbols *this_00;
  
  pDVar1 = this->fields;
  this_00 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)symbols);
  if (this_00 != (DecimalFormatSymbols *)0x0) {
    DecimalFormatSymbols::DecimalFormatSymbols(this_00,symbols);
  }
  pDVar2 = (pDVar1->symbols).super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr;
  if (pDVar2 != (DecimalFormatSymbols *)0x0) {
    (*(pDVar2->super_UObject)._vptr_UObject[1])();
  }
  (pDVar1->symbols).super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr = this_00;
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setDecimalFormatSymbols(const DecimalFormatSymbols& symbols) {
    fields->symbols.adoptInstead(new DecimalFormatSymbols(symbols));
    touchNoError();
}